

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockcache.cc
# Opt level: O2

bool bcache_remove_file(filemgr *file)

{
  fnamedic_item *fname;
  bool bVar1;
  size_t sVar2;
  fnamedic_item **ppfVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  
  _garbage_collect_zombie_fnames();
  fname = (file->bcache)._M_b._M_p;
  if (fname != (fnamedic_item *)0x0) {
    pthread_spin_lock(&bcache_lock);
    bVar4 = _file_empty(fname);
    if (bVar4) {
      hash_remove(&fnamedic,&fname->hash_elem);
      pthread_spin_unlock(&bcache_lock);
      iVar5 = writer_lock(&filelist_lock);
      ppfVar3 = file_list;
      sVar2 = num_files;
      if (iVar5 == 0) {
        bVar4 = false;
        for (uVar6 = 1; uVar6 - sVar2 != 1; uVar6 = uVar6 + 1) {
          if (ppfVar3[uVar6 - 1] == fname) {
            bVar4 = true;
          }
          if ((uVar6 < sVar2) && (bVar4)) {
            ppfVar3[uVar6 - 1] = ppfVar3[uVar6];
          }
        }
        bVar1 = true;
        if (bVar4) {
          ppfVar3[sVar2 - 1] = (fnamedic_item *)0x0;
          num_files = sVar2 - 1;
          if ((fname->ref_count).super___atomic_base<unsigned_int>._M_i != 0) {
            list_push_front(&file_zombies,&fname->le);
            bVar1 = false;
          }
        }
        writer_unlock(&filelist_lock);
        if (!bVar1) {
          return false;
        }
        if (!bVar4) {
          return false;
        }
      }
      else {
        fwrite("Error in _fname_try_free(): Failed to acquire WriterLock on filelist_lock!\n",0x4b,1
               ,_stderr);
      }
      _fname_free(fname);
      return true;
    }
    pthread_spin_unlock(&bcache_lock);
  }
  return false;
}

Assistant:

bool bcache_remove_file(struct filemgr *file)
{
    bool rv = false;
    struct fnamedic_item *fname_item;

    // Before proceeding with deletion, garbage collect zombie files
    _garbage_collect_zombie_fnames();
    fname_item = file->bcache;

    if (fname_item) {
        // acquire lock
        spin_lock(&bcache_lock);
        // file must be empty
        if (!_file_empty(fname_item)) {
            spin_unlock(&bcache_lock);
            DBG("Warning: failed to remove fnamedic_item instance for a file '%s' "
                "because the fnamedic_item instance is not empty!\n",
                file->filename);
            return rv;
        }

        // remove from fname dictionary hash table
        hash_remove(&fnamedic, &fname_item->hash_elem);
        spin_unlock(&bcache_lock);

        // We don't need to grab the file buffer cache's partition locks
        // at once because this function is only invoked when there are
        // no database handles that access the file.
        if (_fname_try_free(fname_item)) {
            _fname_free(fname_item); // no other callers accessing this file
            rv = true;
        } // else fnamedic_item is in use by _bcache_evict. Deletion delayed
    }
    return rv;
}